

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

void CloseDest(void)

{
  WriteDest();
  if (FP_Output != (FILE *)0x0) {
    if (size != -1) {
      if (destlen - size != 0 && size <= destlen) {
        ErrorInt("File exceeds \'size\' by",destlen - size,PASS3);
      }
      memset(WriteBuffer,0,0x2000);
      if (destlen < size) {
        do {
          WBLength = size - destlen;
          if (0x1fff < WBLength) {
            WBLength = 0x2000;
          }
          WriteDest();
        } while (destlen < size);
      }
      size = -1;
    }
    fclose((FILE *)FP_Output);
    FP_Output = (FILE *)0x0;
  }
  return;
}

Assistant:

void CloseDest() {
	// Flush buffer before any other operations
	WriteDest();
	// does main output file exist? (to close it)
	if (FP_Output == NULL) return;
	// pad to desired size (and check for exceed of it)
	if (size != -1L) {
		if (destlen > size) {
			ErrorInt("File exceeds 'size' by", destlen - size);
		}
		memset(WriteBuffer, 0, DESTBUFLEN);
		while (destlen < size) {
			WBLength = std::min(aint(DESTBUFLEN), size-destlen);
			WriteDest();
		}
		size = -1L;
	}
	fclose(FP_Output);
	FP_Output = NULL;
}